

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_process.cc
# Opt level: O2

int flyd::flyd_daemon(void)

{
  __pid_t _Var1;
  int iVar2;
  int iVar3;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  undefined1 local_1048 [12];
  undefined1 local_1038 [12];
  undefined1 local_1028 [12];
  undefined1 local_1018 [12];
  undefined1 local_1008 [12];
  undefined1 local_ff8 [12];
  Logger local_fe8;
  
  umask(0);
  _Var1 = fork();
  if (_Var1 == 0) {
    if (muduo::g_logLevel < 3) {
      muduo::Logger::SourceFile::SourceFile<102>
                ((SourceFile *)local_1008,
                 (char (*) [102])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
                );
      file_00._12_4_ = 0;
      file_00.data_ = (char *)local_1008._0_8_;
      file_00.size_ = local_1008._8_4_;
      muduo::Logger::Logger(&local_fe8,file_00,0x2b);
      muduo::LogStream::operator<<(&local_fe8.impl_.stream_,"THIS IS MASTER PROCESS\n ");
      muduo::Logger::~Logger(&local_fe8);
    }
    prctl(0xf,mater_name);
    flyd_process = FLYD_MASTER_PROCESS;
    _Var1 = setsid();
    if (_Var1 == -1) {
      muduo::Logger::SourceFile::SourceFile<102>
                ((SourceFile *)local_1018,
                 (char (*) [102])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
                );
      file_02._12_4_ = 0;
      file_02.data_ = (char *)local_1018._0_8_;
      file_02.size_ = local_1018._8_4_;
      muduo::Logger::Logger(&local_fe8,file_02,0x39,ERROR);
      muduo::LogStream::operator<<(&local_fe8.impl_.stream_,anon_var_dwarf_1674c);
    }
    else {
      iVar2 = open("/dev/null",2);
      if (iVar2 == -1) {
        muduo::Logger::SourceFile::SourceFile<102>
                  ((SourceFile *)local_1028,
                   (char (*) [102])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
                  );
        file_03._12_4_ = 0;
        file_03.data_ = (char *)local_1028._0_8_;
        file_03.size_ = local_1028._8_4_;
        muduo::Logger::Logger(&local_fe8,file_03,0x4c,ERROR);
        muduo::LogStream::operator<<(&local_fe8.impl_.stream_,anon_var_dwarf_1677f);
      }
      else {
        iVar3 = dup2(iVar2,0);
        if (iVar3 == -1) {
          muduo::Logger::SourceFile::SourceFile<102>
                    ((SourceFile *)local_1038,
                     (char (*) [102])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
                    );
          file_04._12_4_ = 0;
          file_04.data_ = (char *)local_1038._0_8_;
          file_04.size_ = local_1038._8_4_;
          muduo::Logger::Logger(&local_fe8,file_04,0x51,ERROR);
          muduo::LogStream::operator<<(&local_fe8.impl_.stream_,anon_var_dwarf_16795);
        }
        else {
          iVar2 = dup2(iVar2,1);
          if (iVar2 != -1) {
            return 0;
          }
          muduo::Logger::SourceFile::SourceFile<102>
                    ((SourceFile *)local_1048,
                     (char (*) [102])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
                    );
          file_01._12_4_ = 0;
          file_01.data_ = (char *)local_1048._0_8_;
          file_01.size_ = local_1048._8_4_;
          muduo::Logger::Logger(&local_fe8,file_01,0x56,ERROR);
          muduo::LogStream::operator<<(&local_fe8.impl_.stream_,anon_var_dwarf_167ab);
        }
      }
    }
  }
  else {
    if (_Var1 != -1) {
      return 1;
    }
    muduo::Logger::SourceFile::SourceFile<102>
              ((SourceFile *)local_ff8,
               (char (*) [102])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_ff8._0_8_;
    file.size_ = local_ff8._8_4_;
    muduo::Logger::Logger(&local_fe8,file,0x27,FATAL);
    muduo::LogStream::operator<<(&local_fe8.impl_.stream_,anon_var_dwarf_16720);
  }
  muduo::Logger::~Logger(&local_fe8);
  return -1;
}

Assistant:

int flyd_daemon() {

        //1.给予守护进程最高文件权限
        umask(0);

        //2.fork子进程作为守护进程
        int flag;
        flag = fork();
        switch (flag)  //fork()出来这个子进程才会成为咱们这里讲解的master进程；
        {
            case -1:
                //创建子进程失败
                LOG_FATAL << "创建master子进程失败,退出\n";
                return -1;
            case 0:
                //master子进程，走到这里直接break;
                LOG_INFO << "THIS IS MASTER PROCESS\n ";
                prctl(PR_SET_NAME, mater_name);
                flyd_process = FLYD_MASTER_PROCESS;
                break;
            default:
                //父进程以往 直接退出exit(0);现在希望回到主流程去释放一些资源
                return 1;  //父进程直接返回1；
                // exit(0);
        } //end switch


        //以下都是master子进程的程序空间了
        //3.调用setsid设置新的会话
        if (setsid() == -1) {
            LOG_ERROR<<"flyd_daemon()中setsid()失败!\n";
            return -1;
        }

        //4.更改文件目录为根文件目录
        //5.关闭用不到的文件描述符
        int i = 0;
        if (i > STDERR_FILENO)  //fd应该是3，这个应该成立
        {
            if (close(i) == -1)  //释放资源这样这个文件描述符就可以被复用；不然这个数字【文件描述符】会被一直占着；
            {
                LOG_ERROR << "ngx_daemon()中close(fd)失败!\n";
                return -1;
            }
        }

        //6.重定向标准输入输出
        int fd = open("/dev/null", O_RDWR);
        if (fd == -1) {
            LOG_ERROR << "ngx_daemon()中open(\"/dev/null\")失败!\n";
            return -1;
        }
        if (dup2(fd, STDIN_FILENO) == -1) //先关闭STDIN_FILENO[这是规矩，已经打开的描述符，动他之前，先close]，类似于指针指向null，让/dev/null成为标准输入；
        {
            LOG_ERROR << "ngx_daemon()中dup2(STDIN)失败!\n";
            return -1;
        }
        if (dup2(fd, STDOUT_FILENO) == -1) //再关闭STDIN_FILENO，类似于指针指向null，让/dev/null成为标准输出；
        {
            LOG_ERROR << "ngx_daemon()中dup2(STDOUT)失败!\n";
            return -1;
        }

        return 0;  //子进程返回
    }